

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZTensor<TFad<6,_double>_>,_3>::TPZManVector
          (TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *this,
          TPZManVector<TPZTensor<TFad<6,_double>_>,_3> *copy)

{
  undefined1 auVar1 [16];
  TPZTensor<TFad<6,_double>_> *pTVar2;
  ulong uVar3;
  ulong *puVar4;
  TPZTensor<TFad<6,_double>_> *pTVar5;
  TPZVec<TPZTensor<TFad<6,_double>_>_> *in_RSI;
  TPZVec<TPZTensor<TFad<6,_double>_>_> *in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t size;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff38;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffff40;
  TPZTensor<TFad<6,_double>_> *local_98;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffffa0;
  TPZTensor<TFad<6,_double>_> *this_00;
  TPZVec<TPZTensor<TFad<6,_double>_>_> *local_38;
  long local_30;
  
  TPZVec<TPZTensor<TFad<6,_double>_>_>::TPZVec(in_RDI);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZManVector_024392e0;
  local_38 = in_RDI + 1;
  do {
    TPZTensor<TFad<6,_double>_>::TPZTensor(in_stack_ffffffffffffffa0);
    local_38 = (TPZVec<TPZTensor<TFad<6,_double>_>_> *)&local_38[0xd].fStore;
  } while (local_38 != (TPZVec<TPZTensor<TFad<6,_double>_>_> *)&in_RDI[0x28].fNAlloc);
  pTVar2 = (TPZTensor<TFad<6,_double>_> *)TPZVec<TPZTensor<TFad<6,_double>_>_>::NElements(in_RSI);
  if ((long)pTVar2 < 4) {
    in_RDI->fStore = (TPZTensor<TFad<6,_double>_> *)(in_RDI + 1);
    in_RDI->fNElements = (int64_t)pTVar2;
    in_RDI->fNAlloc = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pTVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x1a8),0);
    uVar6 = uVar3 + 8;
    if (0xfffffffffffffff7 < uVar3) {
      uVar6 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x1a8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    this_00 = pTVar2;
    puVar4 = (ulong *)operator_new__(uVar6);
    *puVar4 = (ulong)pTVar2;
    pTVar5 = (TPZTensor<TFad<6,_double>_> *)(puVar4 + 1);
    if (pTVar2 != (TPZTensor<TFad<6,_double>_> *)0x0) {
      local_98 = pTVar5;
      do {
        TPZTensor<TFad<6,_double>_>::TPZTensor(this_00);
        local_98 = local_98 + 1;
      } while (local_98 != pTVar5 + (long)pTVar2);
    }
    in_RDI->fStore = pTVar5;
    in_RDI->fNElements = (int64_t)pTVar2;
    in_RDI->fNAlloc = (int64_t)pTVar2;
  }
  for (local_30 = 0; local_30 < (long)pTVar2; local_30 = local_30 + 1) {
    TPZTensor<TFad<6,_double>_>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}